

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

string * __thiscall
pegmatite::InputRange::str_abi_cxx11_(string *__return_storage_ptr__,InputRange *this)

{
  Input *pIVar1;
  Index IVar2;
  char32_t cVar3;
  iterator __begin1;
  stringstream s;
  iterator local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c0.buffer = (this->start).it.buffer;
  pIVar1 = (this->finish).it.buffer;
  IVar2 = (this->finish).it.idx;
  for (local_1c0.idx = (this->start).it.idx;
      (local_1c0.buffer != pIVar1 || (local_1c0.idx != IVar2)); local_1c0.idx = local_1c0.idx + 1) {
    cVar3 = Input::iterator::operator*(&local_1c0);
    std::operator<<(local_1a0,(char)cVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string InputRange::str() const
{
	std::stringstream s;

	for (char32_t c : *this)
	{
		s << static_cast<char>(c);
	}

	return s.str();
}